

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Reg2Int1(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,int C1)

{
  code *pcVar1;
  int C1_00;
  bool bVar2;
  RegSlot R0_00;
  RegSlot R1_00;
  undefined4 *puVar3;
  OpCode op_00;
  int local_40;
  RegSlot local_3c;
  RegSlot local_38;
  int local_34;
  
  local_34 = C1;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x47);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x989,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_008a32fe;
    *puVar3 = 0;
  }
  bVar2 = DynamicProfileInfo::IsEnabled(CheckThisPhase,this->m_functionWrite);
  if (bVar2) {
LAB_008a312f:
    op_00 = ProfiledLdThis;
    if (op != LdThis) {
      op_00 = op;
    }
  }
  else {
    bVar2 = DynamicProfileInfo::IsEnabled(TypedArrayTypeSpecPhase,this->m_functionWrite);
    if (bVar2) goto LAB_008a312f;
    bVar2 = DynamicProfileInfo::IsEnabled(ArrayCheckHoistPhase,this->m_functionWrite);
    op_00 = op;
    if (bVar2) goto LAB_008a312f;
  }
  if (R0 != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_008a32fe;
      *puVar3 = 0;
    }
    R0_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R0);
    if (R1 != 0xffffffff) {
      if (this->m_functionWrite != (FunctionBody *)0x0) {
LAB_008a321d:
        R1_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R1);
        C1_00 = local_34;
        bVar2 = TryWriteReg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,op_00,R0_00,R1_00,local_34);
        if (!bVar2) {
          bVar2 = TryWriteReg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,op_00,R0_00,R1_00,C1_00);
          if (!bVar2) {
            local_40 = C1_00;
            local_3c = R0_00;
            local_38 = R1_00;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op_00,this);
            Data::Write(&this->m_byteCodeData,&local_40,0xc);
          }
        }
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (bVar2) {
        *puVar3 = 0;
        goto LAB_008a321d;
      }
      goto LAB_008a32fe;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_008a32fe:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg2Int1(OpCode op, RegSlot R0, RegSlot R1, int C1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg2Int1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        if (DoDynamicProfileOpcode(CheckThisPhase) ||
            DoDynamicProfileOpcode(TypedArrayTypeSpecPhase) ||
            DoDynamicProfileOpcode(ArrayCheckHoistPhase))
        {
            if (op == OpCode::LdThis)
            {
                op = OpCode::ProfiledLdThis;
            }
        }

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(Reg2Int1, op, R0, R1, C1);
    }